

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLSidAddress.cpp
# Opt level: O2

void __thiscall COLLADASaxFWL::SidAddress::SidAddress(SidAddress *this,String *sidAddress)

{
  this->_vptr_SidAddress = (_func_int **)&PTR__SidAddress_00954020;
  (this->mId)._M_dataplus._M_p = (pointer)&(this->mId).field_2;
  (this->mId)._M_string_length = 0;
  (this->mId).field_2._M_local_buf[0] = '\0';
  (this->mSids).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mSids).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->mSids).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(this->mSids).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
  (this->mMemberSelectionName)._M_dataplus._M_p = (pointer)&(this->mMemberSelectionName).field_2;
  (this->mMemberSelectionName)._M_string_length = 0;
  (this->mMemberSelectionName).field_2._M_local_buf[0] = '\0';
  this->mFirstIndex = 0;
  this->mSecondIndex = 0;
  this->mIsValid = false;
  parseAddress(this,sidAddress);
  return;
}

Assistant:

SidAddress::SidAddress( const String& sidAddress )
		: mMemberSelection(MEMBER_SELECTION_NONE)
		, mFirstIndex(0)
		, mSecondIndex(0)
		, mIsValid(false)
	{
		parseAddress( sidAddress );
	}